

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::SetCallback
          (FlagImpl *this,FlagCallbackFunc mutation_callback)

{
  FlagCallback *pFVar1;
  MutexLock l;
  
  l.mu_ = DataGuard(this);
  absl::lts_20240722::Mutex::Lock();
  pFVar1 = this->callback_;
  if (pFVar1 == (FlagCallback *)0x0) {
    pFVar1 = (FlagCallback *)operator_new(0x10);
    (pFVar1->guard).mu_.super___atomic_base<long>._M_i = 0;
    this->callback_ = pFVar1;
  }
  pFVar1->func = mutation_callback;
  InvokeCallback(this);
  MutexLock::~MutexLock(&l);
  return;
}

Assistant:

void FlagImpl::SetCallback(const FlagCallbackFunc mutation_callback) {
  absl::MutexLock l(DataGuard());

  if (callback_ == nullptr) {
    callback_ = new FlagCallback;
  }
  callback_->func = mutation_callback;

  InvokeCallback();
}